

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spawn_location.hpp
# Opt level: O0

SpawnLocation * SpawnLocation::from_json(string *id,Json *json)

{
  uchar orientation_00;
  uchar pos_y_00;
  uchar pos_x_00;
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *pbVar1;
  uchar uVar2;
  unsigned_short uVar3;
  const_reference pvVar4;
  SpawnLocation *this;
  string local_188;
  string local_168;
  allocator<char> local_141;
  key_type local_140;
  uchar local_11a;
  allocator<char> local_119;
  undefined1 local_118 [6];
  uint8_t starting_life;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d8;
  string *node_id;
  key_type local_c8;
  uchar local_a2;
  allocator<char> local_a1;
  undefined1 local_a0 [6];
  uint8_t orientation;
  uchar local_7a;
  allocator<char> local_79;
  undefined1 local_78 [6];
  uint8_t pos_y;
  uchar local_55;
  uint8_t pos_x;
  allocator<char> local_41;
  key_type local_40;
  unsigned_short local_1a;
  Json *pJStack_18;
  uint16_t map_id;
  Json *json_local;
  string *id_local;
  
  pJStack_18 = json;
  json_local = (Json *)id;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"mapId",&local_41);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(json,&local_40);
  uVar3 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator_unsigned_short<unsigned_short,_0>(pvVar4);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  pbVar1 = pJStack_18;
  local_1a = uVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_78,"posX",&local_79);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pbVar1,(key_type *)local_78);
  uVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator_unsigned_char<unsigned_char,_0>(pvVar4);
  std::__cxx11::string::~string((string *)local_78);
  std::allocator<char>::~allocator(&local_79);
  pbVar1 = pJStack_18;
  local_55 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a0,"posY",&local_a1);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pbVar1,(key_type *)local_a0);
  uVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator_unsigned_char<unsigned_char,_0>(pvVar4);
  std::__cxx11::string::~string((string *)local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pbVar1 = pJStack_18;
  local_7a = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"orientation",(allocator<char> *)((long)&node_id + 7));
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pbVar1,&local_c8);
  uVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator_unsigned_char<unsigned_char,_0>(pvVar4);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&node_id + 7));
  pbVar1 = pJStack_18;
  local_a2 = uVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_118,"nodeId",&local_119);
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pbVar1,(key_type *)local_118);
  nlohmann::
  basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::
  operator_basic_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_f8,pvVar4);
  std::__cxx11::string::~string((string *)local_118);
  std::allocator<char>::~allocator(&local_119);
  pbVar1 = pJStack_18;
  local_d8 = &local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"startingLife",&local_141)
  ;
  pvVar4 = nlohmann::
           basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::at(pbVar1,&local_140);
  uVar2 = nlohmann::
          basic_json<nlohmann::ordered_map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::operator_unsigned_char<unsigned_char,_0>(pvVar4);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator(&local_141);
  local_11a = uVar2;
  this = (SpawnLocation *)operator_new(0x50);
  std::__cxx11::string::string
            ((string *)&local_168,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)json_local);
  uVar3 = local_1a;
  pos_x_00 = local_55;
  pos_y_00 = local_7a;
  orientation_00 = local_a2;
  uVar2 = local_11a;
  std::__cxx11::string::string((string *)&local_188,local_d8);
  SpawnLocation(this,&local_168,uVar3,pos_x_00,pos_y_00,orientation_00,uVar2,&local_188);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_f8);
  return this;
}

Assistant:

static SpawnLocation* from_json(const std::string& id, const Json& json)
    {
        uint16_t map_id = json.at("mapId");
        uint8_t pos_x = json.at("posX");
        uint8_t pos_y = json.at("posY");
        uint8_t orientation = json.at("orientation");
        const std::string& node_id = json.at("nodeId");
        uint8_t starting_life = json.at("startingLife");

        return new SpawnLocation(id, map_id, pos_x, pos_y, orientation, starting_life, node_id);
    }